

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestSuite * __thiscall testing::UnitTest::GetMutableTestSuite(UnitTest *this,int i)

{
  UnitTestImpl *this_00;
  TestSuite *pTVar1;
  int i_local;
  UnitTest *this_local;
  
  this_00 = impl(this);
  pTVar1 = internal::UnitTestImpl::GetMutableSuiteCase(this_00,i);
  return pTVar1;
}

Assistant:

TestSuite* UnitTest::GetMutableTestSuite(int i) {
  return impl()->GetMutableSuiteCase(i);
}